

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O2

void cmCMakePresetsErrors::INVALID_PRESET_NAMED(string *presetName,cmJSONState *state)

{
  string local_30;
  
  cmStrCat<char_const(&)[18],std::__cxx11::string_const&,char_const(&)[2]>
            (&local_30,(char (*) [18])"Invalid preset: \"",presetName,(char (*) [2])0x75f3de);
  cmJSONState::AddError(state,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void INVALID_PRESET_NAMED(const std::string& presetName, cmJSONState* state)
{
  state->AddError(cmStrCat("Invalid preset: \"", presetName, "\""));
}